

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O3

int SUNHashMap_Insert(SUNHashMap map,char *key,void *value)

{
  SUNHashMapKeyValue *ppSVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  SUNHashMapKeyValue pSVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  char cVar10;
  ulong uVar11;
  
  iVar7 = -1;
  if (value != (void *)0x0 && (key != (char *)0x0 && map != (SUNHashMap)0x0)) {
    uVar11 = 0x100000001b3;
    cVar10 = *key;
    if (cVar10 == '\0') {
      uVar11 = 0x100000001b3;
    }
    else {
      pcVar9 = key + 1;
      do {
        uVar11 = ((long)cVar10 ^ uVar11) * -0x340d631b7bdddcdb;
        cVar10 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while (cVar10 != '\0');
    }
    iVar7 = map->max_size;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)iVar7;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar11;
    iVar8 = SUB164(auVar4 % auVar3,0);
    ppSVar1 = map->buckets;
    lVar5 = SUB168(auVar4 % auVar3,0) << 0x20;
    if (*(long *)((long)ppSVar1 + (lVar5 >> 0x1d)) != 0) {
      bVar2 = iVar8 < iVar7;
      iVar8 = iVar7;
      if (bVar2) {
        lVar5 = lVar5 >> 0x20;
        do {
          if ((lVar5 != -1) && (ppSVar1[lVar5] == (SUNHashMapKeyValue)0x0)) {
            iVar8 = (int)lVar5;
            break;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar7);
      }
      if (iVar8 < 0) {
        return -1;
      }
      if (iVar8 == iVar7) {
        return -2;
      }
    }
    pSVar6 = (SUNHashMapKeyValue)malloc(0x10);
    iVar7 = -1;
    if (pSVar6 != (SUNHashMapKeyValue)0x0) {
      pSVar6->key = key;
      pSVar6->value = value;
      ppSVar1[iVar8] = pSVar6;
      map->size = map->size + 1;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

int SUNHashMap_Insert(SUNHashMap map, const char* key, void* value)
{
  int idx;
  int retval;
  SUNHashMapKeyValue kvp;

  if (map == NULL || key == NULL || value == NULL) { return (-1); }

  /* We want the index to be in (0, map->max_size) */
  idx = (int)(fnv1a_hash(key) % map->max_size);

  /* Check if the bucket is already filled */
  if (map->buckets[idx] != NULL)
  {
    /* Find the next open spot */
    retval = SUNHashMap_Iterate(map, idx, sunHashMapLinearProbeInsert, NULL);
    if (retval < 0) { return (-1); /* error occurred */ }
    if (retval == map->max_size) { return (-2); /* no open entry */ }

    idx = retval;
  }

  /* Create the key-value pair */
  kvp = (SUNHashMapKeyValue)malloc(sizeof(*kvp));
  if (kvp == NULL) { return (-1); }

  kvp->key   = key;
  kvp->value = value;

  /* Insert the key-value pair */
  map->buckets[idx] = kvp;
  map->size++;

  return (0);
}